

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O0

void __thiscall
QEGLPlatformContext::QEGLPlatformContext
          (QEGLPlatformContext *this,QSurfaceFormat *format,QPlatformOpenGLContext *share,
          EGLDisplay display,EGLConfig *config,Flags flags)

{
  QSurfaceFormatPrivate *pQVar1;
  QSurfaceFormatPrivate *pQVar2;
  bool bVar3;
  byte bVar4;
  RenderableType RVar5;
  int iVar6;
  uint uVar7;
  const_pointer piVar8;
  QSurfaceFormatPrivate *pQVar9;
  QDebug *o;
  pointer ppvVar10;
  QSurfaceFormatPrivate *in_RCX;
  long in_RDX;
  QSurfaceFormat *in_RSI;
  QSurfaceFormat *in_RDI;
  undefined8 *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  EGLint i;
  int flags_1;
  bool hasKHRCreateContext;
  QVector<EGLConfig> configs;
  EGLint numConfigs;
  QList<int> contextAttrs;
  undefined4 in_stack_fffffffffffffe58;
  FormatOption in_stack_fffffffffffffe5c;
  QSurfaceFormatPrivate *in_stack_fffffffffffffe60;
  QSurfaceFormat *in_stack_fffffffffffffe68;
  QSurfaceFormatPrivate *in_stack_fffffffffffffe70;
  QSurfaceFormatPrivate *in_stack_fffffffffffffe78;
  EGLDisplay in_stack_fffffffffffffe80;
  QSurfaceFormatPrivate *pQVar11;
  QSurfaceFormatPrivate *local_150;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  char local_108 [32];
  char local_e8 [32];
  char local_c8 [32];
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  uint local_8c [9];
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  char local_50 [32];
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_R9D;
  QPlatformOpenGLContext::QPlatformOpenGLContext
            ((QPlatformOpenGLContext *)in_stack_fffffffffffffe60);
  QNativeInterface::QEGLContext::QEGLContext((QEGLContext *)(in_RDI + 2));
  in_RDI->d = (QSurfaceFormatPrivate *)&PTR__QEGLPlatformContext_00e245f8;
  in_RDI[2].d = (QSurfaceFormatPrivate *)&PTR__QEGLPlatformContext_00e246b0;
  in_RDI[5].d = in_RCX;
  QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)in_stack_fffffffffffffe60);
  *(undefined4 *)((long)&in_RDI[8].d + 4) = 0xffffffff;
  *(undefined1 *)&in_RDI[9].d = 0;
  *(undefined4 *)((long)&in_RDI[9].d + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[10].d = local_c;
  *(undefined1 *)((long)&in_RDI[10].d + 4) = 1;
  QList<int>::QList((QList<int> *)0xa90a20);
  *(undefined1 *)&in_RDI[0xe].d = 0;
  if (in_R8 == (undefined8 *)0x0) {
    local_150 = (QSurfaceFormatPrivate *)
                q_configFromGLFormat
                          (in_stack_fffffffffffffe78,(QSurfaceFormat *)in_stack_fffffffffffffe70,
                           SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                           (int)in_stack_fffffffffffffe68);
  }
  else {
    local_150 = (QSurfaceFormatPrivate *)*in_R8;
  }
  in_RDI[6].d = local_150;
  q_glFormatFromConfig
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (QSurfaceFormat *)in_stack_fffffffffffffe70);
  QSurfaceFormat::operator=((QSurfaceFormat *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)in_stack_fffffffffffffe60);
  if (in_RDX == 0) {
    pQVar11 = (QSurfaceFormatPrivate *)0x0;
  }
  else {
    pQVar11 = *(QSurfaceFormatPrivate **)(in_RDX + 0x18);
  }
  in_RDI[4].d = pQVar11;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0xa90b1e);
  QList<int>::append((QList<int> *)0xa90b30,in_stack_fffffffffffffe5c);
  QSurfaceFormat::majorVersion(in_RSI);
  QList<int>::append((QList<int> *)0xa90b4c,in_stack_fffffffffffffe5c);
  bVar3 = q_hasEglExtension(in_stack_fffffffffffffe70,(char *)pQVar11);
  if (bVar3) {
    QList<int>::append((QList<int> *)0xa90b84,in_stack_fffffffffffffe5c);
    QSurfaceFormat::minorVersion(in_RSI);
    QList<int>::append((QList<int> *)0xa90ba0,in_stack_fffffffffffffe5c);
    bVar4 = QSurfaceFormat::testOption
                      ((QSurfaceFormat *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    RVar5 = QSurfaceFormat::renderableType(in_RDI + 7);
    if (((RVar5 == OpenGL) && (iVar6 = QSurfaceFormat::majorVersion(in_RSI), 2 < iVar6)) &&
       (bVar3 = QSurfaceFormat::testOption
                          ((QSurfaceFormat *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c),
       !bVar3)) {
      bVar4 = bVar4 | 2;
    }
    if (bVar4 != 0) {
      QList<int>::append((QList<int> *)0xa90c2a,in_stack_fffffffffffffe5c);
      QList<int>::append((QList<int> *)0xa90c3b,in_stack_fffffffffffffe5c);
    }
    RVar5 = QSurfaceFormat::renderableType(in_RDI + 7);
    if (RVar5 == OpenGL) {
      QList<int>::append((QList<int> *)0xa90c60,in_stack_fffffffffffffe5c);
      QSurfaceFormat::profile(in_RSI);
      QList<int>::append((QList<int> *)0xa90c8c,in_stack_fffffffffffffe5c);
    }
  }
  bVar3 = QSurfaceFormat::testOption
                    ((QSurfaceFormat *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  if (bVar3) {
    bVar3 = q_hasEglExtension(in_stack_fffffffffffffe70,(char *)pQVar11);
    if (bVar3) {
      QList<int>::append((QList<int> *)0xa90cd3,in_stack_fffffffffffffe5c);
      QList<int>::append((QList<int> *)0xa90ce5,in_stack_fffffffffffffe5c);
    }
    else {
      QSurfaceFormat::setOption
                ((QSurfaceFormat *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                 SUB41((uint)in_stack_fffffffffffffe58 >> 0x18,0));
    }
  }
  RVar5 = QSurfaceFormat::renderableType(in_RDI + 7);
  if (RVar5 == OpenVG) {
    QList<int>::append((QList<int> *)0xa90d23,in_stack_fffffffffffffe5c);
    QList<int>::append((QList<int> *)0xa90d35,in_stack_fffffffffffffe5c);
  }
  QList<int>::append((QList<int> *)0xa90d4c,in_stack_fffffffffffffe5c);
  QList<int>::operator=
            ((QList<int> *)in_stack_fffffffffffffe60,
             (QList<int> *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  RVar5 = QSurfaceFormat::renderableType(in_RDI + 7);
  if (RVar5 == OpenGL) {
    *(undefined4 *)&in_RDI[8].d = 0x30a2;
  }
  else if (RVar5 == OpenVG) {
    *(undefined4 *)&in_RDI[8].d = 0x30a1;
  }
  else {
    *(undefined4 *)&in_RDI[8].d = 0x30a0;
  }
  eglBindAPI(*(undefined4 *)&in_RDI[8].d);
  pQVar9 = in_RDI[5].d;
  pQVar1 = in_RDI[6].d;
  pQVar2 = in_RDI[4].d;
  piVar8 = QList<int>::constData((QList<int> *)0xa90de7);
  pQVar9 = (QSurfaceFormatPrivate *)eglCreateContext(pQVar9,pQVar1,pQVar2,piVar8);
  in_RDI[3].d = pQVar9;
  if ((in_RDI[3].d == (QSurfaceFormatPrivate *)0x0) && (in_RDI[4].d != (QSurfaceFormatPrivate *)0x0)
     ) {
    in_RDI[4].d = (QSurfaceFormatPrivate *)0x0;
    in_stack_fffffffffffffe70 = in_RDI[5].d;
    in_stack_fffffffffffffe78 = in_RDI[6].d;
    piVar8 = QList<int>::constData((QList<int> *)0xa90e49);
    pQVar9 = (QSurfaceFormatPrivate *)
             eglCreateContext(in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,0,piVar8);
    in_RDI[3].d = pQVar9;
  }
  if (in_RDI[3].d == (QSurfaceFormatPrivate *)0x0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
               (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    uVar7 = eglGetError();
    QMessageLogger::warning
              (local_50,"QEGLPlatformContext: Failed to create context: %x",(ulong)uVar7);
  }
  else {
    if ((QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
         ::printConfig == '\0') &&
       (iVar6 = __cxa_guard_acquire(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                                     ::printConfig), iVar6 != 0)) {
      iVar6 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG",(bool *)0x0);
      QEGLPlatformContext::printConfig = iVar6 != 0;
      __cxa_guard_release(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                           ::printConfig);
    }
    if ((QEGLPlatformContext::printConfig & 1U) != 0) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                 (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      QMessageLogger::debug();
      o = QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,(char *)pQVar11);
      QDebug::QDebug(&local_60,o);
      ::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_RDI);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffe78,(char *)pQVar11);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug(&local_68);
      q_printEglConfig(in_stack_fffffffffffffe60,
                       (EGLConfig)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      if ((QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
           ::printAllConfigs == '\0') &&
         (iVar6 = __cxa_guard_acquire(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                                       ::printAllConfigs), iVar6 != 0)) {
        iVar6 = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG",(bool *)0x0);
        QEGLPlatformContext::printAllConfigs = 1 < iVar6;
        __cxa_guard_release(&QEGLPlatformContext(QSurfaceFormat_const&,QPlatformOpenGLContext*,void*,void**,QFlags<QEGLPlatformContext::Flag>)
                             ::printAllConfigs);
      }
      if ((QEGLPlatformContext::printAllConfigs & 1U) != 0) {
        local_8c[0] = 0;
        eglGetConfigs(in_RDI[5].d,0,0,local_8c);
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        QList<void_*>::QList((QList<void_*> *)0xa91073);
        QList<void_*>::resize
                  ((QList<void_*> *)in_stack_fffffffffffffe70,(qsizetype)in_stack_fffffffffffffe68);
        pQVar11 = in_RDI[5].d;
        ppvVar10 = QList<void_*>::data((QList<void_*> *)in_stack_fffffffffffffe60);
        eglGetConfigs(pQVar11,ppvVar10,local_8c[0],local_8c);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)pQVar11,
                   (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QMessageLogger::debug(local_c8,"\nAll EGLConfigs: count=%d",(ulong)local_8c[0]);
        for (uVar7 = 0; iVar6 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
            (int)uVar7 < (int)local_8c[0]; uVar7 = uVar7 + 1) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)pQVar11,iVar6,
                     (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          QMessageLogger::debug(local_e8,"EGLConfig #%d",(ulong)uVar7);
          in_stack_fffffffffffffe60 = in_RDI[5].d;
          QList<void_*>::operator[]
                    ((QList<void_*> *)in_stack_fffffffffffffe60,
                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          q_printEglConfig(in_stack_fffffffffffffe60,
                           (EGLConfig)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58))
          ;
        }
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffe70,(char *)pQVar11,iVar6,
                   (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        QMessageLogger::debug(local_108,"\n");
        QList<void_*>::~QList((QList<void_*> *)0xa911aa);
      }
    }
  }
  QList<int>::~QList((QList<int> *)0xa911c1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QEGLPlatformContext::QEGLPlatformContext(const QSurfaceFormat &format, QPlatformOpenGLContext *share, EGLDisplay display,
                                         EGLConfig *config, Flags flags)
    : m_eglDisplay(display)
    , m_flags(flags)
    , m_ownsContext(true)
{
    m_eglConfig = config ? *config : q_configFromGLFormat(display, format);

    m_format = q_glFormatFromConfig(m_eglDisplay, m_eglConfig, format);
    // m_format now has the renderableType() resolved (it cannot be Default anymore)
    // but does not yet contain version, profile, options.
    m_shareContext = share ? static_cast<QEGLPlatformContext *>(share)->m_eglContext : nullptr;

    QList<EGLint> contextAttrs;
    contextAttrs.append(EGL_CONTEXT_CLIENT_VERSION);
    contextAttrs.append(format.majorVersion());
    const bool hasKHRCreateContext = q_hasEglExtension(m_eglDisplay, "EGL_KHR_create_context");
    if (hasKHRCreateContext) {
        contextAttrs.append(EGL_CONTEXT_MINOR_VERSION_KHR);
        contextAttrs.append(format.minorVersion());
        int flags = 0;
        // The debug bit is supported both for OpenGL and OpenGL ES.
        if (format.testOption(QSurfaceFormat::DebugContext))
            flags |= EGL_CONTEXT_OPENGL_DEBUG_BIT_KHR;
        // The fwdcompat bit is only for OpenGL 3.0+.
        if (m_format.renderableType() == QSurfaceFormat::OpenGL
            && format.majorVersion() >= 3
            && !format.testOption(QSurfaceFormat::DeprecatedFunctions))
            flags |= EGL_CONTEXT_OPENGL_FORWARD_COMPATIBLE_BIT_KHR;
        if (flags) {
            contextAttrs.append(EGL_CONTEXT_FLAGS_KHR);
            contextAttrs.append(flags);
        }
        // Profiles are OpenGL only and mandatory in 3.2+. The value is silently ignored for < 3.2.
        if (m_format.renderableType() == QSurfaceFormat::OpenGL) {
            contextAttrs.append(EGL_CONTEXT_OPENGL_PROFILE_MASK_KHR);
            contextAttrs.append(format.profile() == QSurfaceFormat::CoreProfile
                                ? EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR
                                : EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR);
        }
    }

#ifdef EGL_EXT_protected_content
    if (format.testOption(QSurfaceFormat::ProtectedContent)) {
        if (q_hasEglExtension(m_eglDisplay, "EGL_EXT_protected_content")) {
            contextAttrs.append(EGL_PROTECTED_CONTENT_EXT);
            contextAttrs.append(EGL_TRUE);
        } else {
            m_format.setOption(QSurfaceFormat::ProtectedContent, false);
        }
    }
#endif

    // Special Options for OpenVG surfaces
    if (m_format.renderableType() == QSurfaceFormat::OpenVG) {
        contextAttrs.append(EGL_ALPHA_MASK_SIZE);
        contextAttrs.append(8);
    }

    contextAttrs.append(EGL_NONE);
    m_contextAttrs = contextAttrs;

    switch (m_format.renderableType()) {
    case QSurfaceFormat::OpenVG:
        m_api = EGL_OPENVG_API;
        break;
#ifdef EGL_VERSION_1_4
    case QSurfaceFormat::OpenGL:
        m_api = EGL_OPENGL_API;
        break;
#endif // EGL_VERSION_1_4
    default:
        m_api = EGL_OPENGL_ES_API;
        break;
    }

    eglBindAPI(m_api);
    m_eglContext = eglCreateContext(m_eglDisplay, m_eglConfig, m_shareContext, contextAttrs.constData());
    if (m_eglContext == EGL_NO_CONTEXT && m_shareContext != EGL_NO_CONTEXT) {
        m_shareContext = nullptr;
        m_eglContext = eglCreateContext(m_eglDisplay, m_eglConfig, nullptr, contextAttrs.constData());
    }

    if (m_eglContext == EGL_NO_CONTEXT) {
        qWarning("QEGLPlatformContext: Failed to create context: %x", eglGetError());
        return;
    }

    static const bool printConfig = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG");
    if (printConfig) {
        qDebug() << "Created context for format" << format << "with config:";
        q_printEglConfig(m_eglDisplay, m_eglConfig);

        static const bool printAllConfigs = qEnvironmentVariableIntValue("QT_QPA_EGLFS_DEBUG") > 1;
        if (printAllConfigs) {
            EGLint numConfigs = 0;
            eglGetConfigs(m_eglDisplay, nullptr, 0, &numConfigs);
            QVector<EGLConfig> configs;
            configs.resize(numConfigs);
            eglGetConfigs(m_eglDisplay, configs.data(), numConfigs, &numConfigs);
            qDebug("\nAll EGLConfigs: count=%d", numConfigs);
            for (EGLint i = 0; i < numConfigs; ++i) {
                qDebug("EGLConfig #%d", i);
                q_printEglConfig(m_eglDisplay, configs[i]);
            }
            qDebug("\n");
        }
    }

    // Cannot just call updateFormatFromGL() since it relies on virtuals. Defer it to initialize().
}